

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpnSave.c
# Opt level: O0

void Npn_TruthPermute_rec(char *pStr,int mid,int end)

{
  char cVar1;
  char *pStr_00;
  ulong uVar2;
  int local_28;
  int i;
  char e;
  char *pTemp;
  int end_local;
  int mid_local;
  char *pStr_local;
  
  pStr_00 = Abc_UtilStrsav(pStr);
  local_28 = mid;
  if (mid == end) {
    uVar2 = (ulong)(uint)Npn_TruthPermute_rec::count;
    Npn_TruthPermute_rec::count = Npn_TruthPermute_rec::count + 1;
    printf("%03d: %s\n",uVar2,pStr_00);
  }
  else {
    for (; local_28 <= end; local_28 = local_28 + 1) {
      cVar1 = pStr_00[mid];
      pStr_00[mid] = pStr_00[local_28];
      pStr_00[local_28] = cVar1;
      Npn_TruthPermute_rec(pStr_00,mid + 1,end);
      cVar1 = pStr_00[mid];
      pStr_00[mid] = pStr_00[local_28];
      pStr_00[local_28] = cVar1;
    }
    if (pStr_00 != (char *)0x0) {
      free(pStr_00);
    }
  }
  return;
}

Assistant:

void Npn_TruthPermute_rec( char * pStr, int mid, int end )
{
    static int count = 0;
    char * pTemp = Abc_UtilStrsav(pStr);
    char e;
    int i;
    if ( mid == end ) 
    {
        printf( "%03d: %s\n", count++, pTemp );
        return ;
    }
    for ( i = mid; i <= end; i++ )
    {
        e = pTemp[mid];
        pTemp[mid] = pTemp[i];
        pTemp[i] = e;

        Npn_TruthPermute_rec( pTemp, mid + 1, end );

        e = pTemp[mid];
        pTemp[mid] = pTemp[i];
        pTemp[i] = e;
    }
    ABC_FREE( pTemp );
}